

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

int __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,void *buffer,int byteCount,int C1)

{
  RegSlot RVar1;
  RegSlot RVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  uint local_44;
  int local_40;
  OpLayoutReg2Aux data;
  
  data.super_OpLayoutAuxiliary.R0 = (RegSlot)CONCAT62(in_register_00000032,op);
  CheckOpen(this);
  RVar1 = ConsumeReg(this,R0);
  RVar2 = ConsumeReg(this,R1);
  uVar3 = InsertAuxiliaryData(this,buffer,byteCount);
  local_40 = C1;
  local_44 = uVar3;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar1;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 = RVar2;
  Data::EncodeT<(Js::LayoutSize)0>
            (&this->m_byteCodeData,(OpCode)data.super_OpLayoutAuxiliary.R0,&local_44,0x10,this);
  return uVar3;
}

Assistant:

int ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        int currentOffset   = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }